

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_receiver.c
# Opt level: O2

int messagereceiver_get_received_message_id
              (MESSAGE_RECEIVER_HANDLE message_receiver,delivery_number *message_id)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (message_receiver == (MESSAGE_RECEIVER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1c8;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1c8;
    }
    pcVar4 = "NULL message_receiver";
    iVar3 = 0x1c7;
  }
  else {
    iVar1 = link_get_received_message_id(message_receiver->link,message_id);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x1cf;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x1cf;
    }
    pcVar4 = "Failed getting received message Id";
    iVar3 = 0x1ce;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
            ,"messagereceiver_get_received_message_id",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int messagereceiver_get_received_message_id(MESSAGE_RECEIVER_HANDLE message_receiver, delivery_number* message_id)
{
    int result;

    if (message_receiver == NULL)
    {
        LogError("NULL message_receiver");
        result = MU_FAILURE;
    }
    else
    {
        if (link_get_received_message_id(message_receiver->link, message_id) != 0)
        {
            LogError("Failed getting received message Id");
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }

    return result;
}